

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_parallelogram_shared.h
# Opt level: O2

bool draco::ComputeParallelogramPrediction<draco::MeshAttributeCornerTable,int>
               (int data_entry_id,CornerIndex ci,MeshAttributeCornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *in_data,int num_components
               ,int *out_prediction)

{
  CornerIndex ci_00;
  ulong uVar1;
  ulong uVar2;
  int vert_next;
  int vert_opp;
  int local_3c;
  int local_38;
  int local_34;
  
  ci_00 = MeshAttributeCornerTable::Opposite(table,ci);
  if (ci_00.value_ != 0xffffffff) {
    GetParallelogramEntries<draco::MeshAttributeCornerTable>
              (ci_00,table,vertex_to_data_map,&local_34,&local_38,&local_3c);
    if ((local_34 < data_entry_id) && (local_38 < data_entry_id)) {
      uVar1 = 0;
      if (local_3c < data_entry_id) {
        uVar2 = (ulong)(uint)num_components;
        if (num_components < 1) {
          uVar2 = uVar1;
        }
        for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          out_prediction[uVar1] =
               (in_data[(long)(local_3c * num_components) + uVar1] +
               in_data[(long)(local_38 * num_components) + uVar1]) -
               in_data[(long)(local_34 * num_components) + uVar1];
        }
        uVar1 = 1;
      }
      goto LAB_00152d37;
    }
  }
  uVar1 = 0;
LAB_00152d37:
  return SUB81(uVar1,0);
}

Assistant:

inline bool ComputeParallelogramPrediction(
    int data_entry_id, const CornerIndex ci, const CornerTableT *table,
    const std::vector<int32_t> &vertex_to_data_map, const DataTypeT *in_data,
    int num_components, DataTypeT *out_prediction) {
  const CornerIndex oci = table->Opposite(ci);
  if (oci == kInvalidCornerIndex) {
    return false;
  }
  int vert_opp, vert_next, vert_prev;
  GetParallelogramEntries<CornerTableT>(oci, table, vertex_to_data_map,
                                        &vert_opp, &vert_next, &vert_prev);
  if (vert_opp < data_entry_id && vert_next < data_entry_id &&
      vert_prev < data_entry_id) {
    // Apply the parallelogram prediction.
    const int v_opp_off = vert_opp * num_components;
    const int v_next_off = vert_next * num_components;
    const int v_prev_off = vert_prev * num_components;
    for (int c = 0; c < num_components; ++c) {
      const int64_t in_data_next_off = in_data[v_next_off + c];
      const int64_t in_data_prev_off = in_data[v_prev_off + c];
      const int64_t in_data_opp_off = in_data[v_opp_off + c];
      const int64_t result =
          (in_data_next_off + in_data_prev_off) - in_data_opp_off;

      out_prediction[c] = static_cast<DataTypeT>(result);
    }
    return true;
  }
  return false;  // Not all data is available for prediction
}